

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_replace.h
# Opt level: O2

void absl::StringReplace(string_view s,string_view oldsub,string_view newsub,bool replace_all,
                        string *res)

{
  size_type sVar1;
  size_type __n;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  char *local_38;
  
  local_38 = newsub._M_str;
  local_40 = newsub._M_len;
  __n = oldsub._M_len;
  local_50._M_str = s._M_str;
  local_50._M_len = s._M_len;
  if (__n == 0) {
    std::__cxx11::string::append((char *)res,(ulong)local_50._M_str);
    return;
  }
  __pos = 0;
  while( true ) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_50,oldsub._M_str,__pos,__n);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::append((char *)res,(ulong)(local_50._M_str + __pos));
    std::__cxx11::string::append((char *)res,(ulong)local_38);
    __pos = sVar1 + __n;
    if ((sVar1 == 0xffffffffffffffff) || (!replace_all)) break;
  }
  std::__cxx11::string::append((char *)res,(ulong)(local_50._M_str + __pos));
  return;
}

Assistant:

inline void StringReplace(absl::string_view s, absl::string_view oldsub,
                          absl::string_view newsub, bool replace_all,
                          std::string *res) {
  if (oldsub.empty()) {
    res->append(s.data(), s.size());
    return;
  }

  absl::string_view::size_type start_pos = 0;
  do {
    const absl::string_view::size_type pos = s.find(oldsub, start_pos);
    if (pos == absl::string_view::npos) {
      break;
    }
    res->append(s.data() + start_pos, pos - start_pos);
    res->append(newsub.data(), newsub.size());
    start_pos = pos + oldsub.size();
  } while (replace_all);
  res->append(s.data() + start_pos, s.size() - start_pos);
}